

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

void ftxui::anon_unknown_0::UpdatePixelStyle
               (Screen *screen,stringstream *ss,Pixel *prev,Pixel *next)

{
  ostream *poVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  size_t sVar7;
  long *plVar8;
  char *pcVar9;
  long *local_90;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (next->hyperlink != prev->hyperlink) {
    _GLOBAL__N_1::UpdatePixelStyle();
  }
  bVar2 = *(byte *)next;
  bVar3 = *(byte *)prev;
  if (((bVar3 ^ bVar2) >> 2 & 1) != 0 || (bVar3 & 2) != (bVar2 & 2)) {
    poVar1 = (ostream *)(ss + 0x10);
    if ((bVar2 & 2) == 0 && (bVar3 & 2) != 0) {
      pcVar9 = "\x1b[22m";
    }
    else {
      pcVar9 = "";
      if (((bVar3 & 4) != 0) && (pcVar9 = "", (bVar2 & 4) == 0)) {
        pcVar9 = "\x1b[22m";
      }
    }
    sVar7 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,sVar7);
    pcVar9 = "\x1b[1m";
    if ((*(byte *)next & 2) == 0) {
      pcVar9 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,pcVar9,(ulong)((*(byte *)next & 2) * 2));
    pcVar9 = "\x1b[2m";
    if ((*(byte *)next & 4) == 0) {
      pcVar9 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,(ulong)*(byte *)next & 4);
  }
  if (((*(byte *)prev ^ *(byte *)next) & 0x30) != 0) {
    _GLOBAL__N_1::UpdatePixelStyle();
  }
  bVar2 = *(byte *)next;
  if (((*(byte *)prev ^ bVar2) & 1) != 0) {
    pcVar9 = "\x1b[25m";
    if ((bVar2 & 1) != 0) {
      pcVar9 = "\x1b[5m";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),pcVar9,(ulong)(bVar2 & 1) ^ 5);
  }
  if ((bool)((*(byte *)next & 8) >> 3) != ((*(uint *)prev >> 3 & 1) != 0)) {
    _GLOBAL__N_1::UpdatePixelStyle();
  }
  if ((bool)((*(byte *)next & 0x40) >> 6) != ((*(uint *)prev >> 6 & 1) != 0)) {
    _GLOBAL__N_1::UpdatePixelStyle();
  }
  bVar5 = Color::operator!=(&next->foreground_color,&prev->foreground_color);
  if ((bVar5) || (bVar5 = Color::operator!=(&next->background_color,&prev->background_color), bVar5)
     ) {
    Color::Print_abi_cxx11_(&local_50,&next->foreground_color,false);
    std::operator+(&local_70,"\x1b[",&local_50);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    lVar4 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),(char *)local_90,lVar4);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Color::Print_abi_cxx11_(&local_50,&next->background_color,true);
    std::operator+(&local_70,"\x1b[",&local_50);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar6;
    }
    lVar4 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),(char *)local_90,lVar4);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void UpdatePixelStyle(const Screen* screen,
                      std::stringstream& ss,
                      const Pixel& prev,
                      const Pixel& next) {
  // See https://gist.github.com/egmontkob/eb114294efbcd5adb1944c9f3cb5feda
  if (FTXUI_UNLIKELY(next.hyperlink != prev.hyperlink)) {
    ss << "\x1B]8;;" << screen->Hyperlink(next.hyperlink) << "\x1B\\";
  }

  // Bold
  if (FTXUI_UNLIKELY((next.bold ^ prev.bold) | (next.dim ^ prev.dim))) {
    // BOLD_AND_DIM_RESET:
    ss << ((prev.bold && !next.bold) || (prev.dim && !next.dim) ? "\x1B[22m"
                                                                : "");
    ss << (next.bold ? "\x1B[1m" : "");  // BOLD_SET
    ss << (next.dim ? "\x1B[2m" : "");   // DIM_SET
  }

  // Underline
  if (FTXUI_UNLIKELY(next.underlined != prev.underlined ||
                     next.underlined_double != prev.underlined_double)) {
    ss << (next.underlined          ? "\x1B[4m"     // UNDERLINE
           : next.underlined_double ? "\x1B[21m"    // UNDERLINE_DOUBLE
                                    : "\x1B[24m");  // UNDERLINE_RESET
  }

  // Blink
  if (FTXUI_UNLIKELY(next.blink != prev.blink)) {
    ss << (next.blink ? "\x1B[5m"     // BLINK_SET
                      : "\x1B[25m");  // BLINK_RESET
  }

  // Inverted
  if (FTXUI_UNLIKELY(next.inverted != prev.inverted)) {
    ss << (next.inverted ? "\x1B[7m"     // INVERTED_SET
                         : "\x1B[27m");  // INVERTED_RESET
  }

  // StrikeThrough
  if (FTXUI_UNLIKELY(next.strikethrough != prev.strikethrough)) {
    ss << (next.strikethrough ? "\x1B[9m"     // CROSSED_OUT
                              : "\x1B[29m");  // CROSSED_OUT_RESET
  }

  if (FTXUI_UNLIKELY(next.foreground_color != prev.foreground_color ||
                     next.background_color != prev.background_color)) {
    ss << "\x1B[" + next.foreground_color.Print(false) + "m";
    ss << "\x1B[" + next.background_color.Print(true) + "m";
  }
}